

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  UnitTest *this;
  char *__path;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined8 uVar9;
  ulong uVar10;
  int local_134;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    while( true ) {
      iVar2 = close(*(int *)((long)child_arg + 8));
      if (iVar2 == -1) break;
      bVar1 = AlwaysTrue();
      if (bVar1) {
        this = UnitTest::GetInstance();
        __path = UnitTest::original_working_dir(this);
        iVar2 = chdir(__path);
        if (iVar2 == 0) {
          execv(**child_arg,*child_arg);
          local_f0 = &local_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"execv(","");
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_70 = (ulong *)*plVar4;
          puVar7 = (ulong *)(plVar4 + 2);
          if (local_70 == puVar7) {
            local_60 = *puVar7;
            lStack_58 = plVar4[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *puVar7;
          }
          local_68 = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_90 = (long *)*plVar4;
          plVar6 = plVar4 + 2;
          if (local_90 == plVar6) {
            local_80 = *plVar6;
            lStack_78 = plVar4[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar6;
          }
          local_88 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_d0 = (long *)*plVar4;
          plVar6 = plVar4 + 2;
          if (local_d0 == plVar6) {
            local_c0 = *plVar6;
            lStack_b8 = plVar4[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *plVar6;
          }
          local_c8 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_50._M_dataplus._M_p = (pointer)*plVar4;
          psVar8 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_50._M_dataplus._M_p == psVar8) {
            local_50.field_2._M_allocated_capacity = *psVar8;
            local_50.field_2._8_8_ = plVar4[3];
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar8;
          }
          local_50._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          GetLastErrnoDescription_abi_cxx11_();
          std::operator+(&local_b0,&local_50,&local_130);
          DeathTestAbort(&local_b0);
        }
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"chdir(\"","");
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_d0 = (long *)*plVar4;
        plVar6 = plVar4 + 2;
        if (local_d0 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = plVar4[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
        }
        local_c8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_50._M_dataplus._M_p = (pointer)*plVar4;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)local_50._M_dataplus._M_p == puVar7) {
          local_50.field_2._M_allocated_capacity = *puVar7;
          local_50.field_2._8_8_ = plVar4[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *puVar7;
        }
        local_50._M_string_length = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          uVar9 = local_50.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_68 + local_50._M_string_length) {
          uVar10 = 0xf;
          if (local_70 != &local_60) {
            uVar10 = local_60;
          }
          if (local_68 + local_50._M_string_length <= uVar10) {
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_70,0,(char *)0x0,(ulong)local_50._M_dataplus._M_p);
            goto LAB_001336ec;
          }
        }
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
LAB_001336ec:
        local_b0._M_dataplus._M_p = (pointer)*puVar5;
        psVar8 = puVar5 + 2;
        if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0.field_2._8_8_ = puVar5[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar8;
        }
        local_b0._M_string_length = puVar5[1];
        *puVar5 = psVar8;
        puVar5[1] = 0;
        *(undefined1 *)psVar8 = 0;
        DeathTestAbort(&local_b0);
      }
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_f0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_f0 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar6;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_70 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_70 == puVar7) {
    local_60 = *puVar7;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar7;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_134 = 0x4a3;
  StreamableToString<int>(&local_110,&local_134);
  uVar10 = 0xf;
  if (local_70 != &local_60) {
    uVar10 = local_60;
  }
  if (uVar10 < local_110._M_string_length + local_68) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar9 = local_110.field_2._M_allocated_capacity;
    }
    if (local_110._M_string_length + local_68 <= (ulong)uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
      goto LAB_0013365d;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
LAB_0013365d:
  local_90 = (long *)*puVar5;
  plVar4 = puVar5 + 2;
  if (local_90 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = puVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
  }
  local_88 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_d0 == plVar6) {
    local_c0 = *plVar6;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar6;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_50._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar8) {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar8;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar4[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  DeathTestAbort(&local_b0);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir +
                   "\") failed: " + GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " + GetLastErrnoDescription());
  return EXIT_FAILURE;
}